

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomUI::read(DomUI *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  DomWidget *this_00;
  DomLayoutDefault *this_01;
  DomLayoutFunction *this_02;
  DomCustomWidgets *this_03;
  DomTabStops *this_04;
  DomIncludes *this_05;
  DomResources *this_06;
  DomConnections *this_07;
  DomDesignerData *this_08;
  DomSlots *this_09;
  DomButtonGroups *this_10;
  char16_t *pcVar6;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  undefined4 in_register_00000034;
  QString *pQVar7;
  QString *this_11;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QString local_a0;
  char *local_88;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  pQVar7 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar8 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar8 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar8 + 0x10);
      if ((local_68.m_size == 7) &&
         (QVar9.m_data = local_68.m_data, QVar9.m_size = 7, QVar20.m_data = L"version",
         QVar20.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar9,QVar20), cVar2 != '\0')) {
        QString::QString(&local_a0,*(QChar **)(local_50.ptr + lVar8 + 0x50),
                         *(longlong *)(local_50.ptr + lVar8 + 0x58));
        QString::operator=(&this->m_attr_version,&local_a0);
        this->m_has_attr_version = true;
LAB_00155956:
        piVar1 = (int *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_),2,0x10);
          }
        }
      }
      else {
        if ((local_68.m_size == 8) &&
           (QVar10.m_data = local_68.m_data, QVar10.m_size = 8, QVar21.m_data = L"language",
           QVar21.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar10,QVar21), cVar2 != '\0')) {
          QString::QString(&local_a0,*(QChar **)(local_50.ptr + lVar8 + 0x50),
                           *(longlong *)(local_50.ptr + lVar8 + 0x58));
          QString::operator=(&this->m_attr_language,&local_a0);
          this->m_has_attr_language = true;
          goto LAB_00155956;
        }
        if ((local_68.m_size == 0xb) &&
           (QVar11.m_data = local_68.m_data, QVar11.m_size = 0xb, QVar22.m_data = L"displayname",
           QVar22.m_size = 0xb, cVar2 = QtPrivate::equalStrings(QVar11,QVar22), cVar2 != '\0')) {
          QString::QString(&local_a0,*(QChar **)(local_50.ptr + lVar8 + 0x50),
                           *(longlong *)(local_50.ptr + lVar8 + 0x58));
          QString::operator=(&this->m_attr_displayname,&local_a0);
          this->m_has_attr_displayname = true;
          goto LAB_00155956;
        }
        if ((local_68.m_size == 9) &&
           (QVar12.m_data = local_68.m_data, QVar12.m_size = 9, QVar23.m_data = L"idbasedtr",
           QVar23.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar12,QVar23), cVar2 != '\0')) {
          if (*(long *)(local_50.ptr + lVar8 + 0x58) == 4) {
            QVar13.m_data = *(storage_type_conflict **)(local_50.ptr + lVar8 + 0x50);
            QVar13.m_size = 4;
            QVar24.m_data = L"true";
            QVar24.m_size = 4;
            uVar3 = QtPrivate::equalStrings(QVar13,QVar24);
          }
          else {
            uVar3 = false;
          }
          this->m_attr_idbasedtr = (bool)uVar3;
          this->m_has_attr_idbasedtr = true;
        }
        else if ((local_68.m_size == 0x12) &&
                (QVar14.m_data = local_68.m_data, QVar14.m_size = 0x12,
                QVar25.m_data = L"connectslotsbyname", QVar25.m_size = 0x12,
                cVar2 = QtPrivate::equalStrings(QVar14,QVar25), cVar2 != '\0')) {
          if (*(long *)(local_50.ptr + lVar8 + 0x58) == 4) {
            QVar15.m_data = *(storage_type_conflict **)(local_50.ptr + lVar8 + 0x50);
            QVar15.m_size = 4;
            QVar26.m_data = L"true";
            QVar26.m_size = 4;
            uVar3 = QtPrivate::equalStrings(QVar15,QVar26);
          }
          else {
            uVar3 = false;
          }
          this->m_attr_connectslotsbyname = (bool)uVar3;
          this->m_has_attr_connectslotsbyname = true;
        }
        else if ((local_68.m_size == 9) &&
                (QVar16.m_data = local_68.m_data, QVar16.m_size = 9, QVar27.m_data = L"stdsetdef",
                QVar27.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar16,QVar27), cVar2 != '\0')) {
          QVar17.m_data = *(storage_type_conflict **)(local_50.ptr + lVar8 + 0x50);
          QVar17.m_size = *(qsizetype *)(local_50.ptr + lVar8 + 0x58);
          lVar5 = QString::toIntegral_helper(QVar17,(bool *)0x0,10);
          iVar4 = (int)lVar5;
          if (iVar4 != lVar5) {
            iVar4 = 0;
          }
          this->m_attr_stdsetdef = iVar4;
          this->m_has_attr_stdsetdef = true;
        }
        else {
          if ((local_68.m_size != 9) ||
             (QVar18.m_data = local_68.m_data, QVar18.m_size = 9, QVar28.m_data = L"stdSetDef",
             QVar28.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar18,QVar28), cVar2 == '\0')) {
            local_80.a.m_size = 0x15;
            local_80.a.m_data = "Unexpected attribute ";
            local_80.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_a0,&local_80);
            QXmlStreamReader::raiseError(pQVar7);
            goto LAB_00155956;
          }
          QVar19.m_data = *(storage_type_conflict **)(local_50.ptr + lVar8 + 0x50);
          QVar19.m_size = *(qsizetype *)(local_50.ptr + lVar8 + 0x58);
          lVar5 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
          iVar4 = (int)lVar5;
          if (iVar4 != lVar5) {
            iVar4 = 0;
          }
          this->m_attr_stdSetDef = iVar4;
          this->m_has_attr_stdSetDef = true;
        }
      }
      lVar8 = lVar8 + 0x68;
    } while (local_50.size * 0x68 - lVar8 != 0);
  }
  iVar4 = QXmlStreamReader::error();
  if (iVar4 == 0) {
    do {
      iVar4 = QXmlStreamReader::readNext();
      if (iVar4 != 4) {
        if (iVar4 != 5) goto LAB_00155d95;
        break;
      }
      local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      QVar29.m_data = L"author";
      QVar29.m_size = 6;
      iVar4 = QtPrivate::compareStrings(local_68,QVar29,CaseInsensitive);
      QVar9 = local_68;
      if (iVar4 == 0) {
        QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
        *(byte *)&this->m_children = (byte)this->m_children | 1;
        this_11 = &this->m_author;
        goto LAB_00155d6a;
      }
      QVar30.m_data = L"comment";
      QVar30.m_size = 7;
      iVar4 = QtPrivate::compareStrings(local_68,QVar30,CaseInsensitive);
      if (iVar4 == 0) {
LAB_00155d3b:
        QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
        *(byte *)&this->m_children = (byte)this->m_children | 2;
        this_11 = &this->m_comment;
LAB_00155d6a:
        QString::operator=(this_11,&local_a0);
LAB_00155d72:
        piVar1 = (int *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_),2,0x10);
          }
        }
      }
      else {
        QVar31.m_data = L"legal";
        QVar31.m_size = 5;
        iVar4 = QtPrivate::compareStrings(QVar9,QVar31,CaseInsensitive);
        if (iVar4 == 0) goto LAB_00155d3b;
        QVar32.m_data = L"exportmacro";
        QVar32.m_size = 0xb;
        iVar4 = QtPrivate::compareStrings(local_68,QVar32,CaseInsensitive);
        if (iVar4 == 0) {
          QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
          *(byte *)&this->m_children = (byte)this->m_children | 4;
          this_11 = &this->m_exportMacro;
          goto LAB_00155d6a;
        }
        QVar33.m_data = L"class";
        QVar33.m_size = 5;
        iVar4 = QtPrivate::compareStrings(local_68,QVar33,CaseInsensitive);
        if (iVar4 == 0) {
          QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
          *(byte *)&this->m_children = (byte)this->m_children | 8;
          this_11 = &this->m_class;
          goto LAB_00155d6a;
        }
        QVar34.m_data = L"widget";
        QVar34.m_size = 6;
        pcVar6 = L"widget";
        iVar4 = QtPrivate::compareStrings(local_68,QVar34,CaseInsensitive);
        if (iVar4 != 0) {
          QVar35.m_data = L"layoutdefault";
          QVar35.m_size = 0xd;
          pcVar6 = L"layoutdefault";
          iVar4 = QtPrivate::compareStrings(local_68,QVar35,CaseInsensitive);
          if (iVar4 == 0) {
            this_01 = (DomLayoutDefault *)operator_new(0x10);
            this_01->m_attr_spacing = 0;
            this_01->m_has_attr_spacing = false;
            *(undefined3 *)&this_01->field_0x5 = 0;
            this_01->m_attr_margin = 0;
            this_01->m_has_attr_margin = false;
            *(undefined3 *)&this_01->field_0xd = 0;
            DomLayoutDefault::read(this_01,__fd,__buf_01,(size_t)pcVar6);
            if (this->m_layoutDefault != (DomLayoutDefault *)0x0) {
              operator_delete(this->m_layoutDefault,0x10);
            }
            *(byte *)&this->m_children = (byte)this->m_children | 0x20;
            this->m_layoutDefault = this_01;
            goto LAB_00155d95;
          }
          QVar36.m_data = L"layoutfunction";
          QVar36.m_size = 0xe;
          pcVar6 = L"layoutfunction";
          iVar4 = QtPrivate::compareStrings(local_68,QVar36,CaseInsensitive);
          if (iVar4 == 0) {
            this_02 = (DomLayoutFunction *)operator_new(0x40);
            (this_02->m_attr_spacing).d.d = (Data *)0x0;
            (this_02->m_attr_spacing).d.ptr = (char16_t *)0x0;
            (this_02->m_attr_spacing).d.size = 0;
            *(undefined8 *)&this_02->m_has_attr_spacing = 0;
            (this_02->m_attr_margin).d.d = (Data *)0x0;
            (this_02->m_attr_margin).d.ptr = (char16_t *)0x0;
            (this_02->m_attr_margin).d.size = 0;
            *(undefined8 *)&this_02->m_has_attr_margin = 0;
            DomLayoutFunction::read(this_02,__fd,__buf_02,(size_t)pcVar6);
            setElementLayoutFunction(this,this_02);
            goto LAB_00155d95;
          }
          QVar37.m_data = L"pixmapfunction";
          QVar37.m_size = 0xe;
          iVar4 = QtPrivate::compareStrings(local_68,QVar37,CaseInsensitive);
          if (iVar4 == 0) {
            QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
            *(byte *)&this->m_children = (byte)this->m_children | 0x80;
            this_11 = &this->m_pixmapFunction;
            goto LAB_00155d6a;
          }
          QVar38.m_data = L"customwidgets";
          QVar38.m_size = 0xd;
          pcVar6 = L"customwidgets";
          iVar4 = QtPrivate::compareStrings(local_68,QVar38,CaseInsensitive);
          if (iVar4 == 0) {
            this_03 = (DomCustomWidgets *)operator_new(0x20);
            *(undefined8 *)this_03 = 0;
            (this_03->m_customWidget).d.d = (Data *)0x0;
            (this_03->m_customWidget).d.ptr = (DomCustomWidget **)0x0;
            (this_03->m_customWidget).d.size = 0;
            DomCustomWidgets::read(this_03,__fd,__buf_03,(size_t)pcVar6);
            setElementCustomWidgets(this,this_03);
            goto LAB_00155d95;
          }
          QVar39.m_data = L"tabstops";
          QVar39.m_size = 8;
          pcVar6 = L"tabstops";
          iVar4 = QtPrivate::compareStrings(local_68,QVar39,CaseInsensitive);
          if (iVar4 == 0) {
            this_04 = (DomTabStops *)operator_new(0x20);
            *(undefined8 *)this_04 = 0;
            (this_04->m_tabStop).d.d = (Data *)0x0;
            (this_04->m_tabStop).d.ptr = (QString *)0x0;
            (this_04->m_tabStop).d.size = 0;
            DomTabStops::read(this_04,__fd,__buf_04,(size_t)pcVar6);
            setElementTabStops(this,this_04);
            goto LAB_00155d95;
          }
          QVar40.m_data = L"images";
          QVar40.m_size = 6;
          iVar4 = QtPrivate::compareStrings(local_68,QVar40,CaseInsensitive);
          if (iVar4 == 0) {
            local_a0.d.d._0_4_ = 2;
            local_a0.d.d._4_4_ = 0;
            local_a0.d.ptr._0_4_ = 0;
            local_a0.d._12_8_ = 0;
            local_a0.d.size._4_4_ = 0;
            local_88 = "default";
            QMessageLogger::warning((char *)&local_a0,"Omitting deprecated element <images>.");
            QXmlStreamReader::skipCurrentElement();
            goto LAB_00155d95;
          }
          QVar41.m_data = L"includes";
          QVar41.m_size = 8;
          pcVar6 = L"includes";
          iVar4 = QtPrivate::compareStrings(local_68,QVar41,CaseInsensitive);
          if (iVar4 == 0) {
            this_05 = (DomIncludes *)operator_new(0x20);
            *(undefined8 *)this_05 = 0;
            (this_05->m_include).d.d = (Data *)0x0;
            (this_05->m_include).d.ptr = (DomInclude **)0x0;
            (this_05->m_include).d.size = 0;
            DomIncludes::read(this_05,__fd,__buf_05,(size_t)pcVar6);
            setElementIncludes(this,this_05);
            goto LAB_00155d95;
          }
          QVar42.m_data = L"resources";
          QVar42.m_size = 9;
          pcVar6 = L"resources";
          iVar4 = QtPrivate::compareStrings(local_68,QVar42,CaseInsensitive);
          if (iVar4 == 0) {
            this_06 = (DomResources *)operator_new(0x38);
            (this_06->m_attr_name).d.d = (Data *)0x0;
            (this_06->m_attr_name).d.ptr = (char16_t *)0x0;
            (this_06->m_attr_name).d.size = 0;
            this_06->m_has_attr_name = false;
            *(undefined3 *)&this_06->field_0x19 = 0;
            this_06->m_children = 0;
            (this_06->m_include).d.d = (Data *)0x0;
            (this_06->m_include).d.ptr = (DomResource **)0x0;
            (this_06->m_include).d.size = 0;
            DomResources::read(this_06,__fd,__buf_06,(size_t)pcVar6);
            setElementResources(this,this_06);
            goto LAB_00155d95;
          }
          QVar43.m_data = L"connections";
          QVar43.m_size = 0xb;
          pcVar6 = L"connections";
          iVar4 = QtPrivate::compareStrings(local_68,QVar43,CaseInsensitive);
          if (iVar4 == 0) {
            this_07 = (DomConnections *)operator_new(0x20);
            *(undefined8 *)this_07 = 0;
            (this_07->m_connection).d.d = (Data *)0x0;
            (this_07->m_connection).d.ptr = (DomConnection **)0x0;
            (this_07->m_connection).d.size = 0;
            DomConnections::read(this_07,__fd,__buf_07,(size_t)pcVar6);
            setElementConnections(this,this_07);
            goto LAB_00155d95;
          }
          QVar44.m_data = L"designerdata";
          QVar44.m_size = 0xc;
          pcVar6 = L"designerdata";
          iVar4 = QtPrivate::compareStrings(local_68,QVar44,CaseInsensitive);
          if (iVar4 == 0) {
            this_08 = (DomDesignerData *)operator_new(0x20);
            *(undefined8 *)this_08 = 0;
            (this_08->m_property).d.d = (Data *)0x0;
            (this_08->m_property).d.ptr = (DomProperty **)0x0;
            (this_08->m_property).d.size = 0;
            DomDesignerData::read(this_08,__fd,__buf_08,(size_t)pcVar6);
            setElementDesignerdata(this,this_08);
            goto LAB_00155d95;
          }
          QVar45.m_data = L"slots";
          QVar45.m_size = 5;
          pcVar6 = L"slots";
          iVar4 = QtPrivate::compareStrings(local_68,QVar45,CaseInsensitive);
          if (iVar4 == 0) {
            this_09 = (DomSlots *)operator_new(0x38);
            *(undefined8 *)this_09 = 0;
            (this_09->m_signal).d.d = (Data *)0x0;
            (this_09->m_signal).d.ptr = (QString *)0x0;
            (this_09->m_signal).d.size = 0;
            (this_09->m_slot).d.d = (Data *)0x0;
            (this_09->m_slot).d.ptr = (QString *)0x0;
            (this_09->m_slot).d.size = 0;
            DomSlots::read(this_09,__fd,__buf_09,(size_t)pcVar6);
            setElementSlots(this,this_09);
            goto LAB_00155d95;
          }
          QVar46.m_data = L"buttongroups";
          QVar46.m_size = 0xc;
          pcVar6 = L"buttongroups";
          iVar4 = QtPrivate::compareStrings(local_68,QVar46,CaseInsensitive);
          if (iVar4 == 0) {
            this_10 = (DomButtonGroups *)operator_new(0x20);
            *(undefined8 *)this_10 = 0;
            (this_10->m_buttonGroup).d.d = (Data *)0x0;
            (this_10->m_buttonGroup).d.ptr = (DomButtonGroup **)0x0;
            (this_10->m_buttonGroup).d.size = 0;
            DomButtonGroups::read(this_10,__fd,__buf_10,(size_t)pcVar6);
            setElementButtonGroups(this,this_10);
            goto LAB_00155d95;
          }
          local_80.a.m_size = 0x13;
          local_80.a.m_data = "Unexpected element ";
          local_80.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_a0,&local_80);
          QXmlStreamReader::raiseError(pQVar7);
          goto LAB_00155d72;
        }
        this_00 = (DomWidget *)operator_new(0x160);
        memset(this_00,0,0x160);
        DomWidget::read(this_00,__fd,__buf_00,(size_t)pcVar6);
        setElementWidget(this,this_00);
      }
LAB_00155d95:
      iVar4 = QXmlStreamReader::error();
    } while (iVar4 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomUI::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"version"_s) {
            setAttributeVersion(attribute.value().toString());
            continue;
        }
        if (name == u"language"_s) {
            setAttributeLanguage(attribute.value().toString());
            continue;
        }
        if (name == u"displayname"_s) {
            setAttributeDisplayname(attribute.value().toString());
            continue;
        }
        if (name == u"idbasedtr"_s) {
            setAttributeIdbasedtr(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"connectslotsbyname"_s) {
            setAttributeConnectslotsbyname(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"stdsetdef"_s) {
            setAttributeStdsetdef(attribute.value().toInt());
            continue;
        }
        if (name == u"stdSetDef"_s) {
            setAttributeStdSetDef(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"author"_s, Qt::CaseInsensitive)) {
                setElementAuthor(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"comment"_s, Qt::CaseInsensitive)
                    || !tag.compare(u"legal"_s, Qt::CaseInsensitive)) {
                setElementComment(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"exportmacro"_s, Qt::CaseInsensitive)) {
                setElementExportMacro(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layoutdefault"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutDefault();
                v->read(reader);
                setElementLayoutDefault(v);
                continue;
            }
            if (!tag.compare(u"layoutfunction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutFunction();
                v->read(reader);
                setElementLayoutFunction(v);
                continue;
            }
            if (!tag.compare(u"pixmapfunction"_s, Qt::CaseInsensitive)) {
                setElementPixmapFunction(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"customwidgets"_s, Qt::CaseInsensitive)) {
                auto *v = new DomCustomWidgets();
                v->read(reader);
                setElementCustomWidgets(v);
                continue;
            }
            if (!tag.compare(u"tabstops"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTabStops();
                v->read(reader);
                setElementTabStops(v);
                continue;
            }
            if (!tag.compare(u"images"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <images>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"includes"_s, Qt::CaseInsensitive)) {
                auto *v = new DomIncludes();
                v->read(reader);
                setElementIncludes(v);
                continue;
            }
            if (!tag.compare(u"resources"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResources();
                v->read(reader);
                setElementResources(v);
                continue;
            }
            if (!tag.compare(u"connections"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnections();
                v->read(reader);
                setElementConnections(v);
                continue;
            }
            if (!tag.compare(u"designerdata"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDesignerData();
                v->read(reader);
                setElementDesignerdata(v);
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"buttongroups"_s, Qt::CaseInsensitive)) {
                auto *v = new DomButtonGroups();
                v->read(reader);
                setElementButtonGroups(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}